

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
          (FunctionDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          FunctionPrototypeSyntax *prototype,Token semi,SyntaxList<slang::syntax::SyntaxNode> *items
          ,Token end,NamedBlockClauseSyntax *endBlockName)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppSVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long lVar7;
  
  uVar6 = semi._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = kind;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->prototype).ptr = prototype;
  (this->semi).kind = (short)uVar6;
  (this->semi).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->semi).info = semi.info;
  SVar4 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar1 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_ = sVar1;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ece90;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  (prototype->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppSVar3 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppSVar3 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

FunctionDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, FunctionPrototypeSyntax& prototype, Token semi, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(kind, attributes), prototype(&prototype), semi(semi), items(items), end(end), endBlockName(endBlockName) {
        this->prototype->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }